

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none.hpp
# Opt level: O0

error_code __thiscall
websocketpp::transport::asio::basic_socket::connection::init_asio
          (connection *this,io_service_ptr service,strand_ptr *param_3,bool param_4)

{
  bool bVar1;
  function<void_(std::weak_ptr<void>,_asio::basic_stream_socket<asio::ip::tcp>_&)> *in_RDI;
  error_code eVar2;
  io_context *in_stack_ffffffffffffff78;
  error_code *in_stack_ffffffffffffff80;
  weak_ptr<void> *__args;
  reference_wrapper<asio::io_context> *in_stack_ffffffffffffffa8;
  uint local_10;
  error_category *local_8;
  
  if (*(int *)&in_RDI[1].super__Function_base._M_functor == 0) {
    std::ref<asio::io_context>(in_stack_ffffffffffffff78);
    std::
    make_shared<asio::basic_stream_socket<asio::ip::tcp>,std::reference_wrapper<asio::io_context>>
              (in_stack_ffffffffffffffa8);
    std::shared_ptr<asio::basic_stream_socket<asio::ip::tcp>_>::operator=
              ((shared_ptr<asio::basic_stream_socket<asio::ip::tcp>_> *)in_stack_ffffffffffffff80,
               (shared_ptr<asio::basic_stream_socket<asio::ip::tcp>_> *)in_stack_ffffffffffffff78);
    std::shared_ptr<asio::basic_stream_socket<asio::ip::tcp>_>::~shared_ptr
              ((shared_ptr<asio::basic_stream_socket<asio::ip::tcp>_> *)0x2fe664);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(std::weak_ptr<void>,_asio::basic_stream_socket<asio::ip::tcp>_&)>
                        *)0x2fe672);
    if (bVar1) {
      in_stack_ffffffffffffff80 = (error_code *)&in_RDI[1]._M_invoker;
      __args = (weak_ptr<void> *)&stack0xffffffffffffffa8;
      std::weak_ptr<void>::weak_ptr
                ((weak_ptr<void> *)in_stack_ffffffffffffff80,
                 (weak_ptr<void> *)in_stack_ffffffffffffff78);
      std::
      __shared_ptr_access<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffff80);
      std::function<void_(std::weak_ptr<void>,_asio::basic_stream_socket<asio::ip::tcp>_&)>::
      operator()(in_RDI,__args,(basic_stream_socket<asio::ip::tcp> *)in_stack_ffffffffffffff80);
      std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2fe6c8);
    }
    *(undefined4 *)&in_RDI[1].super__Function_base._M_functor = 1;
    std::error_code::error_code(in_stack_ffffffffffffff80);
  }
  else {
    eVar2 = socket::make_error_code(0);
    local_8 = eVar2._M_cat;
    local_10 = eVar2._M_value;
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = local_10;
  eVar2._M_cat = local_8;
  return eVar2;
}

Assistant:

lib::error_code init_asio (io_service_ptr service, strand_ptr, bool)
    {
        if (m_state != UNINITIALIZED) {
            return socket::make_error_code(socket::error::invalid_state);
        }

        m_socket = lib::make_shared<lib::asio::ip::tcp::socket>(
            lib::ref(*service));

        if (m_socket_init_handler) {
            m_socket_init_handler(m_hdl, *m_socket);
        }

        m_state = READY;

        return lib::error_code();
    }